

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testYca.cpp
# Opt level: O2

void anon_unknown.dwarf_2dac0b::writeReadYca
               (char *fileName,Box2i *dw,RgbaChannels channels,LineOrder writeOrder,
               LineOrder readOrder,_func_void_Array2D<Imf_3_4::Rgba>_ptr_int_int *fillPixels)

{
  float *pfVar1;
  float fVar2;
  float fVar3;
  int iVar4;
  ostream *poVar5;
  undefined8 uVar6;
  long lVar7;
  long lVar8;
  half *phVar9;
  ulong uVar10;
  half *phVar11;
  long lVar12;
  int i;
  ulong uVar13;
  int iVar14;
  int local_b8;
  Array2D<Imf_3_4::Rgba> pixels1;
  Array2D<Imf_3_4::Rgba> pixels2;
  int local_80;
  undefined8 local_78;
  RgbaOutputFile out;
  
  lVar7 = (long)(dw->max).x - (long)(dw->min).x;
  lVar12 = lVar7 + 1;
  lVar8 = (long)(dw->max).y - (long)(dw->min).y;
  uVar10 = lVar8 + 1;
  Imf_3_4::Array2D<Imf_3_4::Rgba>::Array2D(&pixels1,uVar10,lVar12);
  Imf_3_4::Array2D<Imf_3_4::Rgba>::Array2D(&pixels2,uVar10,lVar12);
  poVar5 = (ostream *)std::ostream::operator<<(&std::cout,(int)lVar12);
  poVar5 = std::operator<<(poVar5," by ");
  iVar14 = (int)uVar10;
  poVar5 = (ostream *)std::ostream::operator<<(poVar5,iVar14);
  poVar5 = std::operator<<(poVar5," pixels, channels ");
  poVar5 = (ostream *)std::ostream::operator<<(poVar5,channels);
  poVar5 = std::operator<<(poVar5,", write order ");
  poVar5 = (ostream *)std::ostream::operator<<(poVar5,writeOrder);
  poVar5 = std::operator<<(poVar5,", read order ");
  poVar5 = (ostream *)std::ostream::operator<<(poVar5,readOrder);
  std::endl<char,std::char_traits<char>>(poVar5);
  (*fillPixels)(&pixels1,(int)lVar12,iVar14);
  std::operator<<((ostream *)&std::cout,"writing ");
  std::ostream::flush();
  local_78 = 0;
  uVar6 = Imf_3_4::globalThreadCount();
  Imf_3_4::RgbaOutputFile::RgbaOutputFile
            ((RgbaOutputFile *)0x3f800000,0x3f800000,&out,fileName,dw,dw,channels,&local_78,
             writeOrder,4,uVar6);
  Imf_3_4::RgbaOutputFile::setYCRounding((uint)&out,9);
  Imf_3_4::RgbaOutputFile::setFrameBuffer
            ((Rgba *)&out,
             (ulong)(pixels1._data + (-(long)(dw->min).y * pixels1._sizeY - (long)(dw->min).x)),1);
  Imf_3_4::RgbaOutputFile::writePixels((int)&out);
  Imf_3_4::RgbaOutputFile::~RgbaOutputFile(&out);
  std::operator<<((ostream *)&std::cout,"reading ");
  std::ostream::flush();
  iVar4 = Imf_3_4::globalThreadCount();
  Imf_3_4::RgbaInputFile::RgbaInputFile((RgbaInputFile *)&out,fileName,iVar4);
  Imf_3_4::RgbaInputFile::setFrameBuffer
            ((Rgba *)&out,
             (ulong)(pixels2._data + (-(long)(dw->min).y * pixels2._sizeY - (long)(dw->min).x)),1);
  local_b8 = (int)lVar8;
  if (readOrder == INCREASING_Y) {
    for (iVar4 = (dw->min).y; iVar4 <= (dw->max).y; iVar4 = iVar4 + 1) {
      Imf_3_4::RgbaInputFile::readPixels((int)&out);
    }
  }
  else if (readOrder == DECREASING_Y) {
    for (iVar4 = (dw->max).y; (dw->min).y <= iVar4; iVar4 = iVar4 + -1) {
      Imf_3_4::RgbaInputFile::readPixels((int)&out);
    }
  }
  else if (readOrder == RANDOM_Y) {
    if ((int)((long)((ulong)(uint)(iVar14 >> 0x1f) << 0x20 | uVar10 & 0xffffffff) % 5) == 0) {
      __assert_fail("h % 5 != 0",
                    "/workspace/llm4binary/github/license_c_cmakelists/AcademySoftwareFoundation[P]openexr/src/test/OpenEXRTest/testYca.cpp"
                    ,0x88,
                    "void (anonymous namespace)::writeReadYca(const char *, const Box2i &, RgbaChannels, LineOrder, LineOrder, void (*)(Array2D<Rgba> &, int, int))"
                   );
    }
    for (iVar4 = 0; iVar4 <= local_b8; iVar4 = iVar4 + 1) {
      Imf_3_4::RgbaInputFile::readPixels((int)&out);
    }
  }
  else {
    poVar5 = std::operator<<((ostream *)&std::cerr,"invalid line order ");
    poVar5 = (ostream *)std::ostream::operator<<(poVar5,readOrder);
    std::endl<char,std::char_traits<char>>(poVar5);
  }
  Imf_3_4::RgbaInputFile::~RgbaInputFile((RgbaInputFile *)&out);
  poVar5 = std::operator<<((ostream *)&std::cout,"comparing");
  std::endl<char,std::char_traits<char>>(poVar5);
  local_80 = (int)lVar7;
  phVar11 = &(pixels2._data)->a;
  phVar9 = &(pixels1._data)->a;
  lVar12 = 0;
  do {
    if (local_b8 < lVar12) {
      remove(fileName);
      Imf_3_4::Array2D<Imf_3_4::Rgba>::~Array2D(&pixels2);
      Imf_3_4::Array2D<Imf_3_4::Rgba>::~Array2D(&pixels1);
      return;
    }
    for (lVar7 = 0; lVar7 <= local_80; lVar7 = lVar7 + 1) {
      if ((channels & WRITE_C) == 0) {
        fVar2 = *(float *)(_imath_half_to_float_table + (ulong)phVar9[lVar7 * 4 + -2]._h * 4);
        pfVar1 = (float *)(_imath_half_to_float_table + (ulong)phVar11[lVar7 * 4 + -2]._h * 4);
        if ((fVar2 != *pfVar1) || (NAN(fVar2) || NAN(*pfVar1))) {
          __assert_fail("p1.g == p2.g",
                        "/workspace/llm4binary/github/license_c_cmakelists/AcademySoftwareFoundation[P]openexr/src/test/OpenEXRTest/testYca.cpp"
                        ,0xaa,
                        "void (anonymous namespace)::writeReadYca(const char *, const Box2i &, RgbaChannels, LineOrder, LineOrder, void (*)(Array2D<Rgba> &, int, int))"
                       );
        }
        fVar2 = *(float *)(_imath_half_to_float_table + (ulong)phVar9[lVar7 * 4 + -1]._h * 4);
        pfVar1 = (float *)(_imath_half_to_float_table + (ulong)phVar11[lVar7 * 4 + -1]._h * 4);
        if ((fVar2 != *pfVar1) || (NAN(fVar2) || NAN(*pfVar1))) {
          __assert_fail("p1.b == p2.b",
                        "/workspace/llm4binary/github/license_c_cmakelists/AcademySoftwareFoundation[P]openexr/src/test/OpenEXRTest/testYca.cpp"
                        ,0xab,
                        "void (anonymous namespace)::writeReadYca(const char *, const Box2i &, RgbaChannels, LineOrder, LineOrder, void (*)(Array2D<Rgba> &, int, int))"
                       );
        }
      }
      else {
        fVar2 = *(float *)(_imath_half_to_float_table + (ulong)phVar9[lVar7 * 4 + -1]._h * 4);
        pfVar1 = (float *)(_imath_half_to_float_table + (ulong)phVar9[lVar7 * 4 + -2]._h * 4);
        uVar10 = (ulong)phVar9[lVar7 * 4 + -2]._h;
        if (*pfVar1 <= fVar2 && fVar2 != *pfVar1) {
          uVar10 = (ulong)phVar9[lVar7 * 4 + -1]._h;
        }
        fVar2 = *(float *)(_imath_half_to_float_table + uVar10 * 4);
        pfVar1 = (float *)(_imath_half_to_float_table + (ulong)phVar9[lVar7 * 4 + -3]._h * 4);
        if (fVar2 < *pfVar1 || fVar2 == *pfVar1) {
          uVar10 = (ulong)phVar9[lVar7 * 4 + -3]._h;
        }
        fVar2 = *(float *)(_imath_half_to_float_table + (ulong)phVar11[lVar7 * 4 + -1]._h * 4);
        pfVar1 = (float *)(_imath_half_to_float_table + (ulong)phVar11[lVar7 * 4 + -2]._h * 4);
        uVar13 = (ulong)phVar11[lVar7 * 4 + -2]._h;
        if (*pfVar1 <= fVar2 && fVar2 != *pfVar1) {
          uVar13 = (ulong)phVar11[lVar7 * 4 + -1]._h;
        }
        fVar2 = *(float *)(_imath_half_to_float_table + uVar13 * 4);
        pfVar1 = (float *)(_imath_half_to_float_table + (ulong)phVar11[lVar7 * 4 + -3]._h * 4);
        if (fVar2 < *pfVar1 || fVar2 == *pfVar1) {
          uVar13 = (ulong)phVar11[lVar7 * 4 + -3]._h;
        }
        fVar2 = *(float *)(_imath_half_to_float_table + uVar10 * 4);
        fVar3 = *(float *)(_imath_half_to_float_table + uVar13 * 4);
        if (0.03 < (float)(~-(uint)(fVar3 < fVar2) & (uint)(fVar3 - fVar2) |
                          (uint)(fVar2 - fVar3) & -(uint)(fVar3 < fVar2))) {
          __assert_fail("equalWithAbsError (p1Max, p2Max, 0.03f)",
                        "/workspace/llm4binary/github/license_c_cmakelists/AcademySoftwareFoundation[P]openexr/src/test/OpenEXRTest/testYca.cpp"
                        ,0xa6,
                        "void (anonymous namespace)::writeReadYca(const char *, const Box2i &, RgbaChannels, LineOrder, LineOrder, void (*)(Array2D<Rgba> &, int, int))"
                       );
        }
      }
      if (((channels & WRITE_A) != 0) &&
         ((fVar2 = *(float *)(_imath_half_to_float_table + (ulong)phVar9[lVar7 * 4]._h * 4),
          pfVar1 = (float *)(_imath_half_to_float_table + (ulong)phVar11[lVar7 * 4]._h * 4),
          fVar2 != *pfVar1 || (NAN(fVar2) || NAN(*pfVar1))))) {
        __assert_fail("p1.a == p2.a",
                      "/workspace/llm4binary/github/license_c_cmakelists/AcademySoftwareFoundation[P]openexr/src/test/OpenEXRTest/testYca.cpp"
                      ,0xae,
                      "void (anonymous namespace)::writeReadYca(const char *, const Box2i &, RgbaChannels, LineOrder, LineOrder, void (*)(Array2D<Rgba> &, int, int))"
                     );
      }
    }
    lVar12 = lVar12 + 1;
    phVar11 = phVar11 + pixels2._sizeY * 4;
    phVar9 = phVar9 + pixels1._sizeY * 4;
  } while( true );
}

Assistant:

void
writeReadYca (
    const char   fileName[],
    const Box2i& dw,
    RgbaChannels channels,
    LineOrder    writeOrder,
    LineOrder    readOrder,
    void (*fillPixels) (Array2D<Rgba>& pixels, int w, int h))
{
    int           w = dw.max.x - dw.min.x + 1;
    int           h = dw.max.y - dw.min.y + 1;
    Array2D<Rgba> pixels1 (h, w);
    Array2D<Rgba> pixels2 (h, w);

    cout << w << " by " << h
         << " pixels, "
            "channels "
         << channels
         << ", "
            "write order "
         << writeOrder
         << ", "
            "read order "
         << readOrder << endl;

    fillPixels (pixels1, w, h);

    cout << "writing " << flush;

    {
        RgbaOutputFile out (
            fileName,
            dw,
            dw, // display window, data window
            channels,
            1,          // pixelAspectRatio
            V2f (0, 0), // screenWindowCenter
            1,          // screenWindowWidth
            writeOrder);

        out.setYCRounding (9, 9);
        out.setFrameBuffer (&pixels1[-dw.min.y][-dw.min.x], 1, w);
        out.writePixels (h);
    }

    cout << "reading " << flush;

    {
        RgbaInputFile in (fileName);

        in.setFrameBuffer (&pixels2[-dw.min.y][-dw.min.x], 1, w);

        switch (readOrder)
        {
            case INCREASING_Y:

                for (int y = dw.min.y; y <= dw.max.y; ++y)
                    in.readPixels (y);

                break;

            case DECREASING_Y:

                for (int y = dw.max.y; y >= dw.min.y; --y)
                    in.readPixels (y);

                break;

            case RANDOM_Y:

                assert (h % 5 != 0);

                for (int i = 0; i < h; ++i)
                {
                    int y = dw.min.y + (i * 5) % h;
                    in.readPixels (y);
                }

                break;
            case NUM_LINEORDERS:
            default:
                cerr << "invalid line order " << int (readOrder) << std::endl;
                break;
        }
    }

    cout << "comparing" << endl;

    for (int y = 0; y < h; ++y)
    {
        for (int x = 0; x < w; ++x)
        {
            const Rgba& p1 = pixels1[y][x];
            const Rgba& p2 = pixels2[y][x];

            if (channels & WRITE_C)
            {
                float p1Max = max (p1.r, max (p1.g, p1.b));
                float p2Max = max (p2.r, max (p2.g, p2.b));

                assert (equalWithAbsError (p1Max, p2Max, 0.03f));
            }
            else
            {
                assert (p1.g == p2.g);
                assert (p1.b == p2.b);
            }

            if (channels & WRITE_A) { assert (p1.a == p2.a); }
        }
    }

    remove (fileName);
}